

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

string * __thiscall
wabt::interp::Thread::TraceSource::Pick_abi_cxx11_
          (string *__return_storage_ptr__,TraceSource *this,Index index,Instr instr)

{
  float fVar1;
  Enum EVar2;
  Value *pVVar3;
  Type TVar4;
  ValueType VVar5;
  long lVar6;
  ulong uVar7;
  pointer pGVar8;
  char *pcVar9;
  uint n;
  int iVar10;
  double dVar11;
  allocator<char> local_41;
  ulong local_40;
  ulong local_38;
  
  pVVar3 = Thread::Pick(this->thread_,index);
  fVar1 = (float)(pVVar3->field_0).f32_;
  uVar7 = (ulong)(uint)fVar1;
  local_40 = (ulong)*(uint *)((long)&pVVar3->field_0 + 4);
  local_38 = *(ulong *)((long)&pVVar3->field_0 + 8);
  iVar10 = index - 4;
  n = 3;
  while ((n != 0 && (TVar4 = Opcode::GetParamType(&instr.op,n), TVar4.enum_ == Void))) {
    iVar10 = iVar10 + 1;
    n = n - 1;
  }
  if (n < index) {
LAB_001544ad:
    if ((instr.op.enum_ - TableSet < 4) && (instr.op.enum_ - TableSet != 2)) {
      pGVar8 = (pointer)(this->thread_->mod_->desc_).tables.
                        super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (ulong)instr.field_2.imm_u32 * 0x30;
    }
    else {
      if (instr.op.enum_ - LocalSet < 2) {
        VVar5 = GetLocalType(this,instr.field_2.imm_u32);
        EVar2 = VVar5.enum_;
        goto LAB_00154513;
      }
      if (instr.op.enum_ != GlobalSet) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"?",&local_41);
        return __return_storage_ptr__;
      }
      pGVar8 = (this->thread_->mod_->desc_).globals.
               super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (ulong)instr.field_2.imm_u32 * 0x90;
    }
    EVar2 = *(Enum *)((long)&(((TableType *)&pGVar8->type)->super_ExternType).field_0xc + lVar6);
  }
  else {
    TVar4 = Opcode::GetParamType(&instr.op,-iVar10);
    EVar2 = TVar4.enum_;
    if (EVar2 == Void) goto LAB_001544ad;
  }
LAB_00154513:
  switch(EVar2) {
  case ExternRef:
    pcVar9 = "externref";
    goto LAB_0015454e;
  case FuncRef:
    pcVar9 = "funcref";
LAB_0015454e:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:%zd",pcVar9,local_40 << 0x20 | uVar7);
    break;
  default:
    abort();
  case V128:
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"0x%08x 0x%08x 0x%08x 0x%08x",uVar7,local_40,local_38,
               local_38 >> 0x20);
    break;
  case F64:
    dVar11 = (double)((local_40 << 0x20) + uVar7);
    goto LAB_001545e1;
  case F32:
    dVar11 = (double)fVar1;
LAB_001545e1:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%g",dVar11);
    break;
  case I64:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%lu",(local_40 << 0x20) + uVar7);
    break;
  case I32:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%u",uVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Thread::TraceSource::Pick(Index index, Instr instr) {
  Value val = thread_->Pick(index);
  const char* reftype;
  // Estimate number of operands.
  // TODO: Instead, record this accurately in opcode.def.
  Index num_operands = 3;
  for (Index i = 3; i >= 1; i--) {
    if (instr.op.GetParamType(i) == ValueType::Void) {
      num_operands--;
    } else {
      break;
    }
  }
  auto type = index > num_operands
                  ? Type(ValueType::Void)
                  : instr.op.GetParamType(num_operands - index + 1);
  if (type == ValueType::Void) {
    // Void should never be displayed normally; we only expect to see it when
    // the stack may have different a different type. This is likely to occur
    // with an index; try to see which type we should expect.
    switch (instr.op) {
      case Opcode::GlobalSet: type = GetGlobalType(instr.imm_u32); break;
      case Opcode::LocalSet:
      case Opcode::LocalTee:  type = GetLocalType(instr.imm_u32); break;
      case Opcode::TableSet:
      case Opcode::TableGrow:
      case Opcode::TableFill: type = GetTableElementType(instr.imm_u32); break;
      default: return "?";
    }
  }

  switch (type) {
    case ValueType::I32: return StringPrintf("%u", val.Get<u32>());
    case ValueType::I64: return StringPrintf("%" PRIu64, val.Get<u64>());
    case ValueType::F32: return StringPrintf("%g", val.Get<f32>());
    case ValueType::F64: return StringPrintf("%g", val.Get<f64>());
    case ValueType::V128: {
      auto v = val.Get<v128>();
      return StringPrintf("0x%08x 0x%08x 0x%08x 0x%08x", v.u32(0), v.u32(1),
                          v.u32(2), v.u32(3));
    }

    case ValueType::FuncRef:    reftype = "funcref"; break;
    case ValueType::ExternRef:  reftype = "externref"; break;

    default:
      WABT_UNREACHABLE;
      break;
  }

  // Handle ref types.
  return StringPrintf("%s:%" PRIzd, reftype, val.Get<Ref>().index);
}